

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>_>
::PropagateResult(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>_>
                  *this,BasicFlatConverter *cvt,int i,double lb,double ub,Context ctx)

{
  bool bVar1;
  Context CVar2;
  reference this_00;
  undefined8 uVar3;
  ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>_>
  *in_RSI;
  undefined8 in_RDI;
  exception *exc;
  Context ctx_redef;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>_>::Container>_>
  *in_stack_fffffffffffffe40;
  Context *in_stack_fffffffffffffe48;
  Context in_stack_fffffffffffffe54;
  double in_stack_fffffffffffffe60;
  double in_stack_fffffffffffffe68;
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>
  *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  Context ctx_00;
  undefined4 in_stack_fffffffffffffe8c;
  CStringRef in_stack_fffffffffffffe90;
  BasicCStringRef<char> local_50;
  CtxVal local_48;
  Context local_34 [7];
  ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>_>
  *local_18;
  
  ctx_00.value_ = (CtxVal)((ulong)in_RDI >> 0x20);
  local_18 = in_RSI;
  this_00 = std::
            deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>_>::Container>_>
            ::operator[](in_stack_fffffffffffffe40,
                         CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  CVar2 = Container::GetRedefContext(this_00);
  local_34[0] = CVar2;
  bVar1 = Context::IsNone(local_34);
  if (!bVar1) {
    local_48 = local_34[0].value_;
    in_stack_fffffffffffffe7f =
         Context::IsSubsetOf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe54);
    if (!(bool)in_stack_fffffffffffffe7f) {
      uVar3 = __cxa_allocate_exception(0x18);
      fmt::BasicCStringRef<char>::BasicCStringRef
                (&local_50,
                 "Part of expression redefinition\ncould be lost. Please contact\nAMPL customer support."
                );
      Error::Error((Error *)CONCAT44(in_stack_fffffffffffffe8c,CVar2.value_),
                   in_stack_fffffffffffffe90,ctx_00.value_);
      __cxa_throw(uVar3,&Error::typeinfo,Error::~Error);
    }
  }
  GetConstraint(local_18,in_stack_fffffffffffffe3c);
  ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
  ::
  PropagateResult<mp::CustomStaticConstraint<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,mp::PowerConeId>>
            ((ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,ctx_00);
  return;
}

Assistant:

void PropagateResult(BasicFlatConverter& cvt,
                       int i,
                       double lb, double ub, Context ctx) override {
    try {
      // Too strong: instead, differentiate context
      // in which the redefinition happened #248.
      // MP_ASSERT_ALWAYS(ctx.IsSubsetOf(GetContext())
      //                  || IsBridgingToBeConsidered(i),
      auto ctx_redef = cons_[i].GetRedefContext();
      MP_ASSERT_ALWAYS(ctx_redef.IsNone()
                           || ctx.IsSubsetOf(ctx_redef),
                       "Part of expression redefinition\n"
                       "could be lost. Please contact\n"
                       "AMPL customer support.");
      static_cast<Converter&>(cvt).PropagateResult(
            GetConstraint(i), lb, ub, ctx);
    } catch (const std::exception& exc) {
      MP_RAISE(Converter::GetTypeName() +
               std::string(": propagating result for constraint ") +
               std::to_string(i) + "\nof type '" +
               Constraint::GetTypeName() +
               "':\n" + exc.what());
    }
  }